

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

xmlNanoHTTPCtxtPtr xmlNanoHTTPNewCtxt(char *URL)

{
  xmlNanoHTTPCtxtPtr ret;
  char *URL_local;
  
  URL_local = (char *)(*xmlMalloc)(0xb0);
  if ((xmlNanoHTTPCtxtPtr)URL_local == (xmlNanoHTTPCtxtPtr)0x0) {
    xmlHTTPErrMemory("allocating context");
    URL_local = (char *)0x0;
  }
  else {
    memset(URL_local,0,0xb0);
    ((xmlNanoHTTPCtxtPtr)URL_local)->port = 0x50;
    ((xmlNanoHTTPCtxtPtr)URL_local)->returnValue = 0;
    ((xmlNanoHTTPCtxtPtr)URL_local)->fd = -1;
    ((xmlNanoHTTPCtxtPtr)URL_local)->ContentLength = -1;
    xmlNanoHTTPScanURL((xmlNanoHTTPCtxtPtr)URL_local,URL);
  }
  return (xmlNanoHTTPCtxtPtr)URL_local;
}

Assistant:

static xmlNanoHTTPCtxtPtr
xmlNanoHTTPNewCtxt(const char *URL) {
    xmlNanoHTTPCtxtPtr ret;

    ret = (xmlNanoHTTPCtxtPtr) xmlMalloc(sizeof(xmlNanoHTTPCtxt));
    if (ret == NULL) {
        xmlHTTPErrMemory("allocating context");
        return(NULL);
    }

    memset(ret, 0, sizeof(xmlNanoHTTPCtxt));
    ret->port = 80;
    ret->returnValue = 0;
    ret->fd = INVALID_SOCKET;
    ret->ContentLength = -1;

    xmlNanoHTTPScanURL(ret, URL);

    return(ret);
}